

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.c
# Opt level: O2

int xmlCheckLanguageID(xmlChar *lang)

{
  xmlChar xVar1;
  long lVar2;
  ulong uVar3;
  byte bVar4;
  byte *pbVar5;
  xmlChar *cur;
  byte *pbVar6;
  bool bVar7;
  
  if (lang == (xmlChar *)0x0) goto LAB_0012f3fe;
  xVar1 = *lang;
  if (((((xVar1 == 'I') || (xVar1 == 'X')) || (xVar1 == 'x')) || (pbVar6 = lang, xVar1 == 'i')) &&
     (pbVar6 = lang, lang[1] == '-')) {
    pbVar6 = lang + 2;
    do {
      bVar4 = *pbVar6;
      pbVar6 = pbVar6 + 1;
    } while ((byte)((bVar4 & 0xdf) + 0xbf) < 0x1a);
    bVar7 = bVar4 == 0;
    goto LAB_0012f400;
  }
  do {
    pbVar5 = pbVar6;
    bVar4 = *pbVar5;
    pbVar6 = pbVar5 + 1;
  } while ((byte)((bVar4 & 0xdf) + 0xbf) < 0x1a);
  uVar3 = (long)pbVar5 - (long)lang;
  if (3 < (long)uVar3) {
    bVar7 = bVar4 == 0 && uVar3 < 9;
    goto LAB_0012f400;
  }
  if (1 < (long)uVar3) {
    bVar7 = true;
    if (bVar4 == 0) goto LAB_0012f400;
    if (bVar4 == 0x2d) {
      bVar4 = *pbVar6;
      if ((byte)(bVar4 - 0x30) < 10) {
LAB_0012f2ba:
        if (((byte)(pbVar6[1] - 0x30) < 10) && ((byte)(pbVar6[2] - 0x30) < 10)) {
          bVar4 = pbVar6[3];
          pbVar6 = pbVar6 + 3;
LAB_0012f3d2:
          if (bVar4 == 0) goto LAB_0012f400;
          if (bVar4 == 0x2d) {
            uVar3 = 0xfffffffffffffff6;
            do {
              bVar4 = pbVar6[uVar3 + 0xb];
              uVar3 = uVar3 + 1;
            } while ((byte)((bVar4 & 0xdf) + 0xbf) < 0x1a);
            if (0xfffffffffffffffb < uVar3) goto LAB_0012f40a;
          }
        }
      }
      else {
        uVar3 = 0xfffffffffffffffb;
        while ((byte)((bVar4 & 0xdf) + 0xbf) < 0x1a) {
          lVar2 = uVar3 + 7;
          uVar3 = uVar3 + 1;
          bVar4 = pbVar5[lVar2];
        }
        pbVar6 = pbVar6 + uVar3 + 5;
        if (uVar3 == 0xfffffffffffffffd) goto LAB_0012f3d2;
        if (uVar3 == 0xffffffffffffffff) {
LAB_0012f31c:
          if (bVar4 == 0) goto LAB_0012f400;
          if (bVar4 == 0x2d) {
            if ((byte)(pbVar6[1] - 0x30) < 10) {
              pbVar6 = pbVar6 + 1;
              goto LAB_0012f2ba;
            }
            uVar3 = 0xfffffffffffffffa;
            do {
              bVar4 = pbVar6[1];
              pbVar6 = pbVar6 + 1;
              uVar3 = uVar3 + 1;
            } while ((byte)((bVar4 & 0xdf) + 0xbf) < 0x1a);
            if (uVar3 < 4) goto LAB_0012f40a;
            if (uVar3 == 0xfffffffffffffffd) goto LAB_0012f3d2;
          }
        }
        else {
          if (uVar3 < 4) {
LAB_0012f40a:
            bVar7 = bVar4 == 0x2d || bVar4 == 0;
            goto LAB_0012f400;
          }
          if (uVar3 == 0xfffffffffffffffe) {
            if (bVar4 == 0) goto LAB_0012f400;
            if (bVar4 == 0x2d) {
              if ((byte)(pbVar5[5] - 0x30) < 10) {
                pbVar6 = pbVar5 + 5;
                goto LAB_0012f2ba;
              }
              uVar3 = 0xfffffffffffffffa;
              do {
                bVar4 = pbVar6[1];
                pbVar6 = pbVar6 + 1;
                uVar3 = uVar3 + 1;
              } while ((byte)((bVar4 & 0xdf) + 0xbf) < 0x1a);
              if (uVar3 == 0xfffffffffffffffd) goto LAB_0012f3d2;
              if (uVar3 < 4) goto LAB_0012f40a;
              if (uVar3 == 0xffffffffffffffff) goto LAB_0012f31c;
            }
          }
        }
      }
    }
  }
LAB_0012f3fe:
  bVar7 = false;
LAB_0012f400:
  return (int)bVar7;
}

Assistant:

int
xmlCheckLanguageID(const xmlChar * lang)
{
    const xmlChar *cur = lang, *nxt;

    if (cur == NULL)
        return (0);
    if (((cur[0] == 'i') && (cur[1] == '-')) ||
        ((cur[0] == 'I') && (cur[1] == '-')) ||
        ((cur[0] == 'x') && (cur[1] == '-')) ||
        ((cur[0] == 'X') && (cur[1] == '-'))) {
        /*
         * Still allow IANA code and user code which were coming
         * from the previous version of the XML-1.0 specification
         * it's deprecated but we should not fail
         */
        cur += 2;
        while (((cur[0] >= 'A') && (cur[0] <= 'Z')) ||
               ((cur[0] >= 'a') && (cur[0] <= 'z')))
            cur++;
        return(cur[0] == 0);
    }
    nxt = cur;
    while (((nxt[0] >= 'A') && (nxt[0] <= 'Z')) ||
           ((nxt[0] >= 'a') && (nxt[0] <= 'z')))
           nxt++;
    if (nxt - cur >= 4) {
        /*
         * Reserved
         */
        if ((nxt - cur > 8) || (nxt[0] != 0))
            return(0);
        return(1);
    }
    if (nxt - cur < 2)
        return(0);
    /* we got an ISO 639 code */
    if (nxt[0] == 0)
        return(1);
    if (nxt[0] != '-')
        return(0);

    nxt++;
    cur = nxt;
    /* now we can have extlang or script or region or variant */
    if ((nxt[0] >= '0') && (nxt[0] <= '9'))
        goto region_m49;

    while (((nxt[0] >= 'A') && (nxt[0] <= 'Z')) ||
           ((nxt[0] >= 'a') && (nxt[0] <= 'z')))
           nxt++;
    if (nxt - cur == 4)
        goto script;
    if (nxt - cur == 2)
        goto region;
    if ((nxt - cur >= 5) && (nxt - cur <= 8))
        goto variant;
    if (nxt - cur != 3)
        return(0);
    /* we parsed an extlang */
    if (nxt[0] == 0)
        return(1);
    if (nxt[0] != '-')
        return(0);

    nxt++;
    cur = nxt;
    /* now we can have script or region or variant */
    if ((nxt[0] >= '0') && (nxt[0] <= '9'))
        goto region_m49;

    while (((nxt[0] >= 'A') && (nxt[0] <= 'Z')) ||
           ((nxt[0] >= 'a') && (nxt[0] <= 'z')))
           nxt++;
    if (nxt - cur == 2)
        goto region;
    if ((nxt - cur >= 5) && (nxt - cur <= 8))
        goto variant;
    if (nxt - cur != 4)
        return(0);
    /* we parsed a script */
script:
    if (nxt[0] == 0)
        return(1);
    if (nxt[0] != '-')
        return(0);

    nxt++;
    cur = nxt;
    /* now we can have region or variant */
    if ((nxt[0] >= '0') && (nxt[0] <= '9'))
        goto region_m49;

    while (((nxt[0] >= 'A') && (nxt[0] <= 'Z')) ||
           ((nxt[0] >= 'a') && (nxt[0] <= 'z')))
           nxt++;

    if ((nxt - cur >= 5) && (nxt - cur <= 8))
        goto variant;
    if (nxt - cur != 2)
        return(0);
    /* we parsed a region */
region:
    if (nxt[0] == 0)
        return(1);
    if (nxt[0] != '-')
        return(0);

    nxt++;
    cur = nxt;
    /* now we can just have a variant */
    while (((nxt[0] >= 'A') && (nxt[0] <= 'Z')) ||
           ((nxt[0] >= 'a') && (nxt[0] <= 'z')))
           nxt++;

    if ((nxt - cur < 5) || (nxt - cur > 8))
        return(0);

    /* we parsed a variant */
variant:
    if (nxt[0] == 0)
        return(1);
    if (nxt[0] != '-')
        return(0);
    /* extensions and private use subtags not checked */
    return (1);

region_m49:
    if (((nxt[1] >= '0') && (nxt[1] <= '9')) &&
        ((nxt[2] >= '0') && (nxt[2] <= '9'))) {
        nxt += 3;
        goto region;
    }
    return(0);
}